

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__author_email
          (ColladaParserAutoGen15Private *this)

{
  byte bVar1;
  long in_RDI;
  StackMemoryManager *unaff_retaddr;
  bool returnValue;
  
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x108) + 0x68))
                    (*(long **)(in_RDI + 0x108),*(undefined8 *)(in_RDI + 0x90),
                     *(long *)(in_RDI + 0x98) - *(long *)(in_RDI + 0x90));
  GeneratedSaxParser::StackMemoryManager::deleteObject(unaff_retaddr);
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  return (bool)(bVar1 & 1);
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__author_email()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__author_email();
        if ( !validationResult ) return false;

    } // validation
#endif

bool returnValue = true;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
ParserError::ErrorType simpleTypeValidationResult = validate__author_email(mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData);
if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
{
    ParserChar msg[21];
    Utils::fillErrorMsg(msg, mLastIncompleteFragmentInCharacterData, 20);
    if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        simpleTypeValidationResult,
        0,
        msg) )
    {
        returnValue =  false;
    }
}
if (!returnValue)
{
    mStackMemoryManager.deleteObject();
    mLastIncompleteFragmentInCharacterData = 0;
    mEndOfDataInCurrentObjectOnStack = 0;
    return returnValue;
}
    } // validation
#endif
returnValue = mImpl->data__author_email(mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData);
mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}